

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.h
# Opt level: O2

Matrix<double,_3,_3> * __thiscall
math::Matrix<double,_3,_3>::transposed
          (Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *this)

{
  Matrix<double,_3,_3> *pMVar1;
  int i;
  long lVar2;
  double *pdVar3;
  int j;
  long lVar4;
  
  pMVar1 = __return_storage_ptr__;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    lVar4 = 0;
    pdVar3 = __return_storage_ptr__->m;
    for (; lVar4 != 3; lVar4 = lVar4 + 1) {
      *pdVar3 = *(double *)((long)this + lVar4 * 8);
      pdVar3 = pdVar3 + 3;
    }
    __return_storage_ptr__ = (Matrix<double,_3,_3> *)((long)__return_storage_ptr__ + 8);
    this = (Matrix<double,_3,_3> *)((long)this + 0x18);
  }
  return pMVar1;
}

Assistant:

inline Matrix<T,M,N>
Matrix<T,N,M>::transposed (void) const
{
    Matrix<T,M,N> ret;
    for (int i = 0; i < N; ++i)
        for (int j = 0; j < M; ++j)
            ret(j,i) = (*this)(i,j);
    return ret;
}